

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

int double_conversion::SizeInHexChars<unsigned_int>(uint number)

{
  int result;
  uint number_local;
  
  result = 0;
  for (number_local = number; number_local != 0; number_local = number_local >> 4) {
    result = result + 1;
  }
  return result;
}

Assistant:

static int SizeInHexChars(S number) {
  DOUBLE_CONVERSION_ASSERT(number > 0);
  int result = 0;
  while (number != 0) {
    number >>= 4;
    result++;
  }
  return result;
}